

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O3

lzma_ret lzma2_encode(void *coder_ptr,lzma_mf *mf,uint8_t *out,size_t *out_pos,size_t out_size)

{
  uint8_t *in;
  size_t *in_pos;
  ulong *puVar1;
  size_t *out_pos_00;
  char cVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  lzma_action lVar5;
  uint32_t limit;
  undefined4 uVar6;
  uint uVar7;
  lzma_ret lVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong __n;
  
  uVar9 = *out_pos;
  if (uVar9 < out_size) {
    in = (uint8_t *)((long)coder_ptr + 0xa0);
    in_pos = (size_t *)((long)coder_ptr + 0x98);
    puVar1 = (ulong *)((long)coder_ptr + 0x88);
    out_pos_00 = (size_t *)((long)coder_ptr + 0x90);
    uVar6 = *coder_ptr;
    do {
      switch(uVar6) {
      case 0:
        if ((mf->write_pos - mf->read_pos) + mf->read_ahead == 0) {
          lVar5 = mf->action;
          if (lVar5 == LZMA_FINISH) {
            *out_pos = uVar9 + 1;
            out[uVar9] = '\0';
          }
          return (uint)(lVar5 != LZMA_RUN);
        }
        if ((*(char *)((long)coder_ptr + 0x81) == '\x01') &&
           (lVar8 = lzma_lzma_encoder_reset
                              (*(lzma_lzma1_encoder **)((long)coder_ptr + 8),
                               (lzma_options_lzma *)((long)coder_ptr + 0x10)), lVar8 != LZMA_OK)) {
          return lVar8;
        }
        *puVar1 = 0;
        *(undefined8 *)((long)coder_ptr + 0x90) = 0;
        *(undefined4 *)coder_ptr = 1;
        uVar7 = 0x200000;
        break;
      case 1:
        uVar7 = 0x200000 - *(int *)puVar1;
        break;
      case 2:
        sVar10 = *out_pos_00;
        goto LAB_0041b73a;
      case 3:
        lzma_bufcpy(in,in_pos,3,out,out_pos,out_size);
        if (*in_pos != 3) {
          return LZMA_OK;
        }
        *(undefined4 *)coder_ptr = 4;
        uVar9 = *out_pos;
      case 4:
        if (mf->read_ahead != 0) {
          __assert_fail("mf->read_ahead == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                        ,0x11d,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
        }
        uVar11 = *puVar1;
        if (mf->read_pos < uVar11) {
          __assert_fail("mf->read_pos >= *left",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                        ,0x11e,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
        }
        uVar13 = out_size - uVar9;
        __n = uVar11;
        if (uVar13 < uVar11) {
          __n = uVar13;
        }
        memcpy(out + uVar9,mf->buffer + (mf->read_pos - uVar11),__n);
        *out_pos = uVar9 + __n;
        *puVar1 = uVar11 - __n;
        uVar6 = 0;
        if (uVar13 < uVar11) {
          return LZMA_OK;
        }
        goto LAB_0041b765;
      default:
        goto switchD_0041b44d_default;
      }
      uVar3 = mf->read_pos;
      uVar4 = mf->read_ahead;
      limit = ((uVar7 + uVar3) - mf->match_len_max) - uVar4;
      if (uVar7 < mf->match_len_max) {
        limit = 0;
      }
      lVar8 = lzma_lzma_encode(*(lzma_lzma1_encoder **)((long)coder_ptr + 8),mf,
                               (uint8_t *)((long)coder_ptr + 0xa6),out_pos_00,0x10000,limit);
      uVar7 = mf->read_ahead;
      uVar11 = (ulong)(((uVar4 + mf->read_pos) - uVar7) - uVar3) + *(long *)((long)coder_ptr + 0x88)
      ;
      *(ulong *)((long)coder_ptr + 0x88) = uVar11;
      uVar9 = *(ulong *)((long)coder_ptr + 0x90);
      if (0x10000 < uVar9) {
        __assert_fail("coder->compressed_size <= LZMA2_CHUNK_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,0xc6,
                      "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (0x200000 < uVar11) {
        __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,199,
                      "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (lVar8 != LZMA_STREAM_END) {
        return LZMA_OK;
      }
      if (uVar9 < uVar11) {
        if (uVar9 == 0) {
          __assert_fail("coder->compressed_size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0x3b,"void lzma2_header_lzma(lzma_lzma2_coder *)");
        }
        cVar2 = *(char *)((long)coder_ptr + 0x80);
        if (cVar2 == '\x01') {
          if (*(char *)((long)coder_ptr + 0x82) == '\x01') {
            *in = 0xe0;
          }
          else {
            *in = 0xc0;
          }
          sVar10 = 0;
        }
        else {
          if (*(char *)((long)coder_ptr + 0x81) == '\x01') {
            *(undefined1 *)((long)coder_ptr + 0xa1) = 0xa0;
          }
          else {
            *(undefined1 *)((long)coder_ptr + 0xa1) = 0x80;
          }
          sVar10 = 1;
        }
        *in_pos = sVar10;
        lVar12 = uVar11 - 1;
        in[sVar10] = in[sVar10] + (char)((ulong)lVar12 >> 0x10);
        *(char *)((long)coder_ptr + sVar10 + 0xa1) = (char)((ulong)lVar12 >> 8);
        *(char *)((long)coder_ptr + sVar10 + 0xa2) = (char)lVar12;
        *(char *)((long)coder_ptr + sVar10 + 0xa3) = (char)(uVar9 - 1 >> 8);
        *(char *)((long)coder_ptr + sVar10 + 0xa4) = (char)(uVar9 - 1);
        if (cVar2 != '\0') {
          lzma_lzma_lclppb_encode((lzma_options_lzma *)((long)coder_ptr + 0x10),in + sVar10 + 5);
          uVar9 = *out_pos_00;
        }
        *(undefined2 *)((long)coder_ptr + 0x80) = 0;
        *(undefined1 *)((long)coder_ptr + 0x82) = 0;
        sVar10 = uVar9 + 6;
        *(size_t *)((long)coder_ptr + 0x90) = sVar10;
        *(undefined4 *)coder_ptr = 2;
LAB_0041b73a:
        lzma_bufcpy(in,in_pos,sVar10,out,out_pos,out_size);
        uVar6 = 0;
        if (*in_pos != *out_pos_00) {
          return LZMA_OK;
        }
      }
      else {
        uVar11 = uVar11 + uVar7;
        *puVar1 = uVar11;
        if (0x200000 < uVar11) {
          __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0xd2,
                        "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        mf->read_ahead = 0;
        if (uVar11 == 0) {
          __assert_fail("coder->uncompressed_size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0x71,"void lzma2_header_uncompressed(lzma_lzma2_coder *)");
        }
        if (0x10000 < uVar11) {
          __assert_fail("coder->uncompressed_size <= LZMA2_CHUNK_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0x72,"void lzma2_header_uncompressed(lzma_lzma2_coder *)");
        }
        *(char *)((long)coder_ptr + 0xa0) = '\x02' - *(char *)((long)coder_ptr + 0x82);
        *(char *)((long)coder_ptr + 0xa1) = (char)((uint)((int)uVar11 + -1) >> 8);
        *(char *)((long)coder_ptr + 0xa2) = (char)uVar11 + -1;
        *(undefined8 *)((long)coder_ptr + 0x98) = 0;
        *(undefined2 *)((long)coder_ptr + 0x81) = 1;
        uVar6 = 3;
      }
LAB_0041b765:
      *(undefined4 *)coder_ptr = uVar6;
switchD_0041b44d_default:
      uVar9 = *out_pos;
    } while (uVar9 < out_size);
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
lzma2_encode(void *coder_ptr, lzma_mf *restrict mf,
		uint8_t *restrict out, size_t *restrict out_pos,
		size_t out_size)
{
	lzma_lzma2_coder *restrict coder = coder_ptr;

	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_INIT:
		// If there's no input left and we are flushing or finishing,
		// don't start a new chunk.
		if (mf_unencoded(mf) == 0) {
			// Write end of payload marker if finishing.
			if (mf->action == LZMA_FINISH)
				out[(*out_pos)++] = 0;

			return mf->action == LZMA_RUN
					? LZMA_OK : LZMA_STREAM_END;
		}

		if (coder->need_state_reset)
			return_if_error(lzma_lzma_encoder_reset(
					coder->lzma, &coder->opt_cur));

		coder->uncompressed_size = 0;
		coder->compressed_size = 0;
		coder->sequence = SEQ_LZMA_ENCODE;

	// Fall through

	case SEQ_LZMA_ENCODE: {
		// Calculate how much more uncompressed data this chunk
		// could accept.
		const uint32_t left = LZMA2_UNCOMPRESSED_MAX
				- coder->uncompressed_size;
		uint32_t limit;

		if (left < mf->match_len_max) {
			// Must flush immediately since the next LZMA symbol
			// could make the uncompressed size of the chunk too
			// big.
			limit = 0;
		} else {
			// Calculate maximum read_limit that is OK from point
			// of view of LZMA2 chunk size.
			limit = mf->read_pos - mf->read_ahead
					+ left - mf->match_len_max;
		}

		// Save the start position so that we can update
		// coder->uncompressed_size.
		const uint32_t read_start = mf->read_pos - mf->read_ahead;

		// Call the LZMA encoder until the chunk is finished.
		const lzma_ret ret = lzma_lzma_encode(coder->lzma, mf,
				coder->buf + LZMA2_HEADER_MAX,
				&coder->compressed_size,
				LZMA2_CHUNK_MAX, limit);

		coder->uncompressed_size += mf->read_pos - mf->read_ahead
				- read_start;

		assert(coder->compressed_size <= LZMA2_CHUNK_MAX);
		assert(coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX);

		if (ret != LZMA_STREAM_END)
			return LZMA_OK;

		// See if the chunk compressed. If it didn't, we encode it
		// as uncompressed chunk. This saves a few bytes of space
		// and makes decoding faster.
		if (coder->compressed_size >= coder->uncompressed_size) {
			coder->uncompressed_size += mf->read_ahead;
			assert(coder->uncompressed_size
					<= LZMA2_UNCOMPRESSED_MAX);
			mf->read_ahead = 0;
			lzma2_header_uncompressed(coder);
			coder->need_state_reset = true;
			coder->sequence = SEQ_UNCOMPRESSED_HEADER;
			break;
		}

		// The chunk did compress at least by one byte, so we store
		// the chunk as LZMA.
		lzma2_header_lzma(coder);

		coder->sequence = SEQ_LZMA_COPY;
	}

	// Fall through

	case SEQ_LZMA_COPY:
		// Copy the compressed chunk along its headers to the
		// output buffer.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				coder->compressed_size,
				out, out_pos, out_size);
		if (coder->buf_pos != coder->compressed_size)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;

	case SEQ_UNCOMPRESSED_HEADER:
		// Copy the three-byte header to indicate uncompressed chunk.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				LZMA2_HEADER_UNCOMPRESSED,
				out, out_pos, out_size);
		if (coder->buf_pos != LZMA2_HEADER_UNCOMPRESSED)
			return LZMA_OK;

		coder->sequence = SEQ_UNCOMPRESSED_COPY;

	// Fall through

	case SEQ_UNCOMPRESSED_COPY:
		// Copy the uncompressed data as is from the dictionary
		// to the output buffer.
		mf_read(mf, out, out_pos, out_size, &coder->uncompressed_size);
		if (coder->uncompressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;
	}

	return LZMA_OK;
}